

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
RemoveCurrent<Memory::HeapAllocator>(EditingIterator *this,HeapAllocator *allocator)

{
  RealCount *pRVar1;
  undefined4 *puVar2;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *pDVar3;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *pDVar4;
  code *pcVar5;
  bool bVar6;
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *buffer;
  undefined8 *in_FS_OFFSET;
  
  buffer = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
           (this->super_Iterator).current;
  if (buffer == (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x94,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar6) goto LAB_002777c8;
    *puVar2 = 0;
    buffer = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
             (this->super_Iterator).current;
  }
  if (buffer == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x95,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar6) {
LAB_002777c8:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar2 = 0;
    buffer = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
             (this->super_Iterator).current;
  }
  pDVar3 = (buffer->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.base;
  pDVar4 = ((anon_union_8_3_7fb8a913_for_prev *)
           (&(buffer->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next + 1))->base;
  (pDVar4->next).base = pDVar3;
  pDVar3->prev = *(anon_union_8_3_7fb8a913_for_prev *)
                  (&(buffer->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next + 1);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &buffer->super_RealCount);
  Memory::HeapAllocator::Free(allocator,buffer,0x98);
  (this->super_Iterator).current = pDVar4;
  pRVar1 = &((this->super_Iterator).list)->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));

            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            AllocatorDelete(TAllocator, allocator, (Node *)node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
        }